

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::EnumDescriptorProto::ParseFromArray
          (EnumDescriptorProto *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pEVar2;
  pointer pEVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  uint8_t cur_byte_3;
  ulong uVar12;
  uint8_t cur_byte_2;
  uint8_t cur_byte;
  ulong *puVar13;
  uint8_t cur_byte_1;
  pointer pEVar14;
  Field local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  *local_38;
  
  pEVar2 = (this->value_).
           super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->value_).
           super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar14 = pEVar2;
  if (pEVar3 != pEVar2) {
    do {
      (**(pEVar14->super_CppMessageObj)._vptr_CppMessageObj)(pEVar14);
      pEVar14 = pEVar14 + 1;
    } while (pEVar14 != pEVar3);
    (this->value_).
    super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar2;
  }
  local_38 = &this->value_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->reserved_name_,
                    (this->reserved_name_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->unknown_fields_)._M_string_length = 0;
  local_40 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (ulong *)(size + (long)raw);
  do {
    if (puVar9 <= raw) goto switchD_00225d77_caseD_3;
    bVar1 = (byte)*raw;
    uVar8 = (ulong)bVar1;
    puVar11 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar8 = (ulong)(bVar1 & 0x7f);
      lVar7 = 7;
      do {
        if ((puVar9 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_00225d77_caseD_3;
        uVar6 = *puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar8 = uVar8 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
        lVar7 = lVar7 + 7;
      } while ((char)(byte)uVar6 < '\0');
    }
    uVar6 = uVar8 >> 3;
    if (((uint)uVar6 == 0) || (puVar9 <= puVar11)) goto switchD_00225d77_caseD_3;
    switch((uint)uVar8 & 7) {
    case 0:
      uVar10 = 0;
      uVar12 = 0;
      while( true ) {
        puVar13 = (ulong *)((long)puVar11 + 1);
        uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
        if (-1 < (char)(byte)*puVar11) break;
        if ((puVar9 <= puVar13) ||
           (bVar4 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar4))
        goto switchD_00225d77_caseD_3;
      }
      local_50.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 1:
      puVar13 = puVar11 + 1;
      if (puVar9 < puVar13) goto switchD_00225d77_caseD_3;
      uVar10 = *puVar11;
      local_50.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 2:
      puVar11 = (ulong *)((long)puVar11 + 1);
      uVar12 = 0;
      uVar10 = 0;
      puVar13 = puVar11;
      while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                      uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
        if (puVar9 <= puVar13) goto switchD_00225d77_caseD_3;
        puVar13 = (ulong *)((long)puVar13 + 1);
        puVar11 = (ulong *)((long)puVar11 + 1);
        bVar4 = 0x38 < uVar10;
        uVar10 = uVar10 + 7;
        if (bVar4) goto switchD_00225d77_caseD_3;
      }
      if (uVar12 <= (ulong)((long)puVar9 - (long)puVar11)) {
        local_50.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
        puVar13 = (ulong *)((long)puVar13 + uVar12);
        uVar10 = (ulong)puVar11 & 0xffffffff;
        goto LAB_00225e52;
      }
    default:
      goto switchD_00225d77_caseD_3;
    case 5:
      puVar13 = (ulong *)((long)puVar11 + 4);
      if (puVar9 < puVar13) goto switchD_00225d77_caseD_3;
      uVar10 = (ulong)(uint)*puVar11;
      local_50.int_value_ = 0;
    }
    uVar12 = 0;
LAB_00225e52:
    raw = puVar13;
  } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar12));
  local_50.int_value_ = local_50.int_value_ | uVar10 & 0xffffffff;
  uVar10 = uVar6 << 0x20 | uVar12;
  local_50.type_ = (byte)(uVar10 >> 0x30) | (byte)uVar8 & 7;
  local_50.size_ = (uint32_t)uVar12;
  local_50.id_ = (uint16_t)(uVar10 >> 0x20);
  if ((short)uVar6 != 0) {
    do {
      if ((ushort)uVar6 < 6) {
        (this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar6 & 0x3f);
      }
      raw = puVar13;
      if ((ushort)uVar6 == 5) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>(&this->reserved_name_);
        protozero::Field::get
                  (&local_50,
                   (this->reserved_name_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
      else {
        uVar5 = (uint)uVar6 & 0xffff;
        if (uVar5 == 2) {
          std::
          vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
          ::emplace_back<>(local_38);
          pEVar2 = (this->value_).
                   super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (*pEVar2[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                    (pEVar2 + -1,local_50.int_value_,(ulong)local_50.size_);
        }
        else if (uVar5 == 1) {
          protozero::Field::get(&local_50,&this->name_);
        }
        else {
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_50,local_40);
        }
      }
      do {
        if (puVar9 <= raw) goto switchD_00225d77_caseD_3;
        bVar1 = (byte)*raw;
        uVar8 = (ulong)(uint)bVar1;
        puVar11 = (ulong *)((long)raw + 1);
        if ((char)bVar1 < '\0') {
          uVar8 = (ulong)(bVar1 & 0x7f);
          lVar7 = 7;
          do {
            if ((puVar9 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_00225d77_caseD_3;
            uVar6 = *puVar11;
            puVar11 = (ulong *)((long)puVar11 + 1);
            uVar8 = uVar8 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
            lVar7 = lVar7 + 7;
          } while ((char)(byte)uVar6 < '\0');
        }
        uVar6 = uVar8 >> 3;
        if (((uint)uVar6 == 0) || (puVar9 <= puVar11)) goto switchD_00225d77_caseD_3;
        switch((uint)uVar8 & 7) {
        case 0:
          uVar10 = 0;
          uVar12 = 0;
          while( true ) {
            puVar13 = (ulong *)((long)puVar11 + 1);
            uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
            if (-1 < (char)(byte)*puVar11) break;
            if ((puVar9 <= puVar13) ||
               (bVar4 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar4))
            goto switchD_00225d77_caseD_3;
          }
          local_50.int_value_ = uVar10 & 0xffffffff00000000;
          break;
        case 1:
          puVar13 = puVar11 + 1;
          if (puVar9 < puVar13) goto switchD_00225d77_caseD_3;
          uVar10 = *puVar11;
          local_50.int_value_ = uVar10 & 0xffffffff00000000;
          break;
        case 2:
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar12 = 0;
          uVar10 = 0;
          puVar13 = puVar11;
          while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                          uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
            if (puVar9 <= puVar13) goto switchD_00225d77_caseD_3;
            puVar13 = (ulong *)((long)puVar13 + 1);
            puVar11 = (ulong *)((long)puVar11 + 1);
            bVar4 = 0x38 < uVar10;
            uVar10 = uVar10 + 7;
            if (bVar4) goto switchD_00225d77_caseD_3;
          }
          if (uVar12 <= (ulong)((long)puVar9 - (long)puVar11)) {
            local_50.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
            puVar13 = (ulong *)((long)puVar13 + uVar12);
            uVar10 = (ulong)puVar11 & 0xffffffff;
            goto LAB_0022612b;
          }
        default:
          goto switchD_00225d77_caseD_3;
        case 5:
          puVar13 = (ulong *)((long)puVar11 + 4);
          if (puVar9 < puVar13) goto switchD_00225d77_caseD_3;
          uVar10 = (ulong)(uint)*puVar11;
          local_50.int_value_ = 0;
        }
        uVar12 = 0;
LAB_0022612b:
        raw = puVar13;
      } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar12));
      local_50.int_value_ = local_50.int_value_ | uVar10 & 0xffffffff;
      uVar10 = uVar6 << 0x20 | uVar12;
      local_50.type_ = (byte)(uVar10 >> 0x30) | (byte)uVar8 & 7;
      local_50.size_ = (uint32_t)uVar12;
      local_50.id_ = (uint16_t)(uVar10 >> 0x20);
    } while ((short)uVar6 != 0);
  }
switchD_00225d77_caseD_3:
  return puVar9 == (ulong *)raw;
}

Assistant:

bool EnumDescriptorProto::ParseFromArray(const void* raw, size_t size) {
  value_.clear();
  reserved_name_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* name */:
        field.get(&name_);
        break;
      case 2 /* value */:
        value_.emplace_back();
        value_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* reserved_name */:
        reserved_name_.emplace_back();
        field.get(&reserved_name_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}